

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O2

void Cmd_angleconvtest(FCommandLine *argv,APlayerPawn *who,int key)

{
  undefined4 in_register_00000014;
  double dVar1;
  double dVar2;
  
  Printf("Testing degrees to angle conversion:\n",who,CONCAT44(in_register_00000014,key));
  for (dVar1 = -900.0; dVar1 < 900.0; dVar1 = dVar1 + 45.0) {
    dVar2 = dVar1 * 11930464.711111112;
    Printf("Angle = %.5f: xs_RoundToInt = %08x, unsigned cast = %08x, signed cast = %08x\n",dVar1,
           dVar2 + 6755399441055744.0,(long)dVar2,(ulong)(uint)(int)dVar2);
  }
  return;
}

Assistant:

CCMD(angleconvtest)
{
	Printf("Testing degrees to angle conversion:\n");
	for (double ang = -5 * 180.; ang < 5 * 180.; ang += 45.)
	{
		unsigned ang1 = DAngle(ang).BAMs();
		unsigned ang2 = (unsigned)(ang * (0x40000000 / 90.));
		unsigned ang3 = (unsigned)(int)(ang * (0x40000000 / 90.));
		Printf("Angle = %.5f: xs_RoundToInt = %08x, unsigned cast = %08x, signed cast = %08x\n",
			ang, ang1, ang2, ang3);
	}
}